

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O0

int __thiscall crnlib::dxt_image::init(dxt_image *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  undefined7 extraout_var;
  element *peVar2;
  uint in_ECX;
  uint in_EDX;
  byte in_R8B;
  bool clear_elements_local;
  uint height_local;
  uint width_local;
  dxt_format fmt_local;
  dxt_image *this_local;
  
  bVar1 = init_internal(this,(dxt_format)ctx,in_EDX,in_ECX);
  if (bVar1) {
    vector<crnlib::dxt_image::element>::resize(&this->m_elements,this->m_total_elements,false);
    peVar2 = vector<crnlib::dxt_image::element>::operator[](&this->m_elements,0);
    this->m_pElements = peVar2;
    if ((in_R8B & 1) != 0) {
      this = (dxt_image *)memset(this->m_pElements,0,(ulong)this->m_total_elements << 3);
    }
    this_local._7_1_ = 1;
  }
  else {
    this_local._7_1_ = 0;
    this = (dxt_image *)CONCAT71(extraout_var,bVar1);
  }
  return (int)CONCAT71((int7)((ulong)this >> 8),this_local._7_1_);
}

Assistant:

bool dxt_image::init(dxt_format fmt, uint width, uint height, bool clear_elements)
    {
        if (!init_internal(fmt, width, height))
        {
            return false;
        }

        m_elements.resize(m_total_elements);
        m_pElements = &m_elements[0];

        if (clear_elements)
        {
            memset(m_pElements, 0, sizeof(element) * m_total_elements);
        }

        return true;
    }